

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.h
# Opt level: O0

TestAllTypes *
google::protobuf::DynamicCastMessage<edition_unittest::TestAllTypes>(MessageLite *from)

{
  TestAllTypes *pTVar1;
  bad_cast *this;
  TestAllTypes *destination_message;
  MessageLite *from_local;
  
  pTVar1 = DynamicCastMessage<edition_unittest::TestAllTypes>(from);
  if (pTVar1 == (TestAllTypes *)0x0) {
    this = (bad_cast *)__cxa_allocate_exception(8);
    std::bad_cast::bad_cast(this);
    __cxa_throw(this,&std::bad_cast::typeinfo,std::bad_cast::~bad_cast);
  }
  return pTVar1;
}

Assistant:

const T& DynamicCastMessage(const MessageLite& from) {
  const T* destination_message = DynamicCastMessage<T>(&from);
  if (ABSL_PREDICT_FALSE(destination_message == nullptr)) {
    // If exceptions are enabled, throw.
    // Otherwise, log a fatal error.
#if defined(ABSL_HAVE_EXCEPTIONS)
    throw std::bad_cast();
#endif
    // Move the logging into an out-of-line function to reduce bloat in the
    // caller.
    internal::FailDynamicCast(from, T::default_instance());
  }
  return *destination_message;
}